

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O1

wchar_t scatter_ext(chunk_conflict *c,loc *places,wchar_t n,loc grid,wchar_t d,_Bool need_los,
                   _func__Bool_chunk_ptr_loc *pred)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint32_t uVar6;
  void *p;
  ulong uVar7;
  loc grid_00;
  uint uVar8;
  wchar_t wVar9;
  int iVar10;
  ulong uVar11;
  wchar_t wVar12;
  wchar_t wVar13;
  uint uVar14;
  bool bVar15;
  
  wVar4 = L'\0';
  if (L'\0' < d) {
    wVar4 = d;
  }
  iVar10 = wVar4 * 2 + 1;
  iVar3 = c->width;
  if (iVar10 <= c->width) {
    iVar3 = iVar10;
  }
  if (c->height < iVar10) {
    iVar10 = c->height;
  }
  p = mem_alloc((long)iVar10 * (long)iVar3 * 8);
  wVar4 = grid.y - d;
  wVar9 = grid.y + d;
  uVar8 = 0;
  if (wVar4 <= wVar9) {
    wVar12 = grid.x - d;
    uVar8 = 0;
    do {
      wVar13 = wVar12;
      iVar10 = d * 2 + 1;
      if (wVar12 <= grid.x + d) {
        do {
          grid_00.y = wVar4;
          grid_00.x = wVar13;
          _Var2 = square_in_bounds_fully(c,grid_00);
          if ((((_Var2) &&
               ((d < L'\x02' ||
                (wVar5 = distance((loc_conflict)grid,(loc_conflict)grid_00), wVar5 <= d)))) &&
              ((!need_los || (_Var2 = los(c,(loc_conflict)grid,(loc_conflict)grid_00), _Var2)))) &&
             ((pred == (_func__Bool_chunk_ptr_loc *)0x0 || (_Var2 = (*pred)(c,grid_00), _Var2)))) {
            *(wchar_t *)((long)p + (long)(int)uVar8 * 8) = wVar13;
            *(wchar_t *)((long)p + (long)(int)uVar8 * 8 + 4) = wVar4;
            uVar8 = uVar8 + 1;
          }
          iVar10 = iVar10 + -1;
          wVar13 = wVar13 + L'\x01';
        } while (iVar10 != 0);
      }
      bVar15 = wVar4 != wVar9;
      wVar4 = wVar4 + L'\x01';
    } while (bVar15);
  }
  uVar11 = 0;
  if (0 < (int)uVar8 && L'\0' < n) {
    uVar7 = (ulong)uVar8;
    uVar14 = n + L'\xffffffff';
    if (uVar8 - 1 < (uint)(n + L'\xffffffff')) {
      uVar14 = uVar8 - 1;
    }
    uVar11 = 0;
    do {
      uVar6 = Rand_div((uint32_t)uVar7);
      places[uVar11] = *(loc *)((long)p + (long)(int)uVar6 * 8);
      uVar11 = uVar11 + 1;
      lVar1 = uVar7 * 8;
      uVar7 = uVar7 - 1;
      *(undefined8 *)((long)p + (long)(int)uVar6 * 8) = *(undefined8 *)((long)p + lVar1 + -8);
    } while (uVar14 + 1 != uVar11);
  }
  mem_free(p);
  return (wchar_t)uVar11;
}

Assistant:

int scatter_ext(struct chunk *c, struct loc *places, int n, struct loc grid,
		int d, bool need_los, bool (*pred)(struct chunk *, struct loc))
{
	int result = 0;
	/* Stores feasible locations. */
	struct loc *feas = mem_alloc(MIN(c->width, (1 + 2 * MAX(0, d)))
			* (size_t) MIN(c->height, (1 + 2 * MAX(0, d)))
			* sizeof(*feas));
	int nfeas = 0;
	struct loc g;

	/* Get the feasible locations. */
	for (g.y = grid.y - d; g.y <= grid.y + d; ++g.y) {
		for (g.x = grid.x - d; g.x <= grid.x + d; ++g.x) {
			if (!square_in_bounds_fully(c, g)) continue;
			if (d > 1 && distance(grid, g) > d) continue;
			if (need_los && !los(c, grid, g)) continue;
			if (pred && !(*pred)(c, g)) continue;
			feas[nfeas] = g;
			++nfeas;
		}
	}

	/* Assemble the result. */
	while (result < n && nfeas > 0) {
		/* Choose one at random and append it to the outgoing list. */
		int choice = randint0(nfeas);

		places[result] = feas[choice];
		++result;
		/* Shift the last feasible one to replace the one selected. */
		--nfeas;
		feas[choice] = feas[nfeas];
	}

	mem_free(feas);
	return result;
}